

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_avl.c
# Opt level: O0

void test_lessequal(_Bool do_random)

{
  long lVar1;
  tree_element *local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  undefined4 local_90;
  byte local_89;
  uint32_t i;
  _Bool do_random_local;
  long local_80;
  undefined8 local_78;
  long local_70;
  undefined8 local_68;
  long local_60;
  undefined8 local_58;
  long local_50;
  undefined8 local_48;
  long local_40;
  undefined8 local_38;
  long local_30;
  undefined8 local_28;
  long local_20;
  undefined8 local_18;
  long local_10;
  
  local_89 = do_random;
  cunit_start_test("test_lessequal");
  avl_init(&head,avl_comp_uint32,1);
  add_elements(nodes,(_Bool)(local_89 & 1));
  avl_remove(&head,0x10a178);
  local_90 = 0;
  lVar1 = avl_find_lessequal(&head,&local_90);
  cunit_named_check(lVar1 == 0,"test_lessequal",0x195,"node of element <= 0 found");
  local_10 = avl_find_lessequal(&head,&local_90);
  local_18 = 8;
  if (local_10 == 0) {
    local_98 = 0;
  }
  else {
    local_98 = local_10 + -8;
  }
  cunit_named_check(local_98 == 0,"test_lessequal",0x196,"element <= 0 found");
  local_90 = 2;
  lVar1 = avl_find_lessequal(&head,&local_90);
  cunit_named_check(lVar1 == 0x10a138,"test_lessequal",0x19a,"node of element <= 2 not found");
  local_20 = avl_find_lessequal(&head,&local_90);
  local_28 = 8;
  if (local_20 == 0) {
    local_a0 = 0;
  }
  else {
    local_a0 = local_20 + -8;
  }
  cunit_named_check(local_a0 == 0x10a130,"test_lessequal",0x19b,"element <= 2 not found");
  local_90 = 3;
  lVar1 = avl_find_lessequal(&head,&local_90);
  cunit_named_check(lVar1 == 0x10a138,"test_lessequal",0x19f,"node of element <= 3 not found");
  local_30 = avl_find_lessequal(&head,&local_90);
  local_38 = 8;
  if (local_30 == 0) {
    local_a8 = 0;
  }
  else {
    local_a8 = local_30 + -8;
  }
  cunit_named_check(local_a8 == 0x10a130,"test_lessequal",0x1a0,"element <= 3 not found");
  local_90 = 4;
  lVar1 = avl_find_lessequal(&head,&local_90);
  cunit_named_check(lVar1 == 0x10a1b8,"test_lessequal",0x1a4,"node of element <= 4 not found");
  local_40 = avl_find_lessequal(&head,&local_90);
  local_48 = 8;
  if (local_40 == 0) {
    local_b0 = 0;
  }
  else {
    local_b0 = local_40 + -8;
  }
  cunit_named_check(local_b0 == 0x10a1b0,"test_lessequal",0x1a5,"element <= 4 not found");
  additional_node1.value = 4;
  additional_node1.node.key = &additional_node1;
  avl_insert(&head,0x10a278);
  local_90 = 0;
  lVar1 = avl_find_lessequal(&head,&local_90);
  cunit_named_check(lVar1 == 0,"test_lessequal",0x1ae,"node of element <= 0 found (d)");
  local_50 = avl_find_lessequal(&head,&local_90);
  local_58 = 8;
  if (local_50 == 0) {
    local_b8 = 0;
  }
  else {
    local_b8 = local_50 + -8;
  }
  cunit_named_check(local_b8 == 0,"test_lessequal",0x1af,"element <= 0 found (d)");
  local_90 = 2;
  lVar1 = avl_find_lessequal(&head,&local_90);
  cunit_named_check(lVar1 == 0x10a138,"test_lessequal",0x1b3,"node of element <= 2 not found (d)");
  local_60 = avl_find_lessequal(&head,&local_90);
  local_68 = 8;
  if (local_60 == 0) {
    local_c0 = 0;
  }
  else {
    local_c0 = local_60 + -8;
  }
  cunit_named_check(local_c0 == 0x10a130,"test_lessequal",0x1b4,"element <= 2 not found (d)");
  local_90 = 3;
  lVar1 = avl_find_lessequal(&head,&local_90);
  cunit_named_check(lVar1 == 0x10a138,"test_lessequal",0x1b8,"node of element <= 3 not found (d)");
  local_70 = avl_find_lessequal(&head,&local_90);
  local_78 = 8;
  if (local_70 == 0) {
    local_c8 = 0;
  }
  else {
    local_c8 = local_70 + -8;
  }
  cunit_named_check(local_c8 == 0x10a130,"test_lessequal",0x1b9,"element <= 3 not found (d)");
  local_90 = 4;
  lVar1 = avl_find_lessequal(&head,&local_90);
  cunit_named_check(lVar1 == 0x10a278,"test_lessequal",0x1bd,
                    "node of element <= 4 not found correctly (d)");
  local_80 = avl_find_lessequal(&head,&local_90);
  _i = 8;
  if (local_80 == 0) {
    local_d0 = (tree_element *)0x0;
  }
  else {
    local_d0 = (tree_element *)(local_80 + -8);
  }
  cunit_named_check(local_d0 == &additional_node1,"test_lessequal",0x1be,
                    "element <= 4 not found correctly (d)");
  cunit_end_test("test_lessequal");
  return;
}

Assistant:

static void test_lessequal(bool do_random) {
  uint32_t i;
  START_TEST();

  /* create tree with 1,2,4,5,6 */
  avl_init(&head, avl_comp_uint32, true);
  add_elements(nodes, do_random);
  avl_remove(&head, &nodes[2].node);

  /* find <= 0 */
  i = 0;
  CHECK_TRUE(avl_find_lessequal(&head, &i) == NULL, "node of element <= 0 found");
  CHECK_TRUE(avl_find_le_element(&head, &i, &nodes[3], node) == NULL, "element <= 0 found");

  /* find <= 2 */
  i = 2;
  CHECK_TRUE(avl_find_lessequal(&head, &i) == &nodes[1].node, "node of element <= 2 not found");
  CHECK_TRUE(avl_find_le_element(&head, &i, &nodes[1], node) == &nodes[1], "element <= 2 not found");

  /* find <= 3 */
  i = 3;
  CHECK_TRUE(avl_find_lessequal(&head, &i) == &nodes[1].node, "node of element <= 3 not found");
  CHECK_TRUE(avl_find_le_element(&head, &i, &nodes[1], node) == &nodes[1], "element <= 3 not found");

  /* find <= 4 */
  i = 4;
  CHECK_TRUE(avl_find_lessequal(&head, &i) == &nodes[3].node, "node of element <= 4 not found");
  CHECK_TRUE(avl_find_le_element(&head, &i, &nodes[3], node) == &nodes[3], "element <= 4 not found");

  /* add duplicate with value 4 */
  additional_node1.value = 4;
  additional_node1.node.key = &additional_node1.value;
  avl_insert(&head, &additional_node1.node);

  /* find <= 0 */
  i = 0;
  CHECK_TRUE(avl_find_lessequal(&head, &i) == NULL, "node of element <= 0 found (d)");
  CHECK_TRUE(avl_find_le_element(&head, &i, &nodes[3], node) == NULL, "element <= 0 found (d)");

  /* find <= 2 */
  i = 2;
  CHECK_TRUE(avl_find_lessequal(&head, &i) == &nodes[1].node, "node of element <= 2 not found (d)");
  CHECK_TRUE(avl_find_le_element(&head, &i, &nodes[1], node) == &nodes[1], "element <= 2 not found (d)");

  /* find <= 3 */
  i = 3;
  CHECK_TRUE(avl_find_lessequal(&head, &i) == &nodes[1].node, "node of element <= 3 not found (d)");
  CHECK_TRUE(avl_find_le_element(&head, &i, &nodes[1], node) == &nodes[1], "element <= 3 not found (d)");

  /* find <= 4 */
  i = 4;
  CHECK_TRUE(avl_find_lessequal(&head, &i) == &additional_node1.node, "node of element <= 4 not found correctly (d)");
  CHECK_TRUE(avl_find_le_element(&head, &i, &additional_node1, node) == &additional_node1, "element <= 4 not found correctly (d)");

  END_TEST();
}